

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::use_default_format_selection(SwapchainBuilder *this)

{
  pointer pVVar1;
  
  pVVar1 = (this->info).desired_formats.
           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info).desired_formats.
      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    (this->info).desired_formats.
    super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar1;
  }
  add_desired_formats(this,&(this->info).desired_formats);
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::use_default_format_selection() {
    info.desired_formats.clear();
    add_desired_formats(info.desired_formats);
    return *this;
}